

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TernaryExpression.hpp
# Opt level: O3

size_t __thiscall Kandinsky::TernaryExpression::numberOfConstants(TernaryExpression *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*((this->m_arg1).
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_BaseExpression[9])();
  iVar2 = (*((this->m_arg2).
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_BaseExpression[9])();
  iVar3 = (*((this->m_arg3).
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_BaseExpression[9])();
  return CONCAT44(extraout_var_01,iVar3) +
         CONCAT44(extraout_var_00,iVar2) + CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual size_t numberOfConstants() const
        {
            return m_arg1->numberOfConstants() + m_arg2->numberOfConstants()
                + m_arg3->numberOfConstants();
        }